

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

unsigned_long hash(XML_Parser parser,KEY s)

{
  size_t len;
  uint64_t uVar1;
  sipkey key;
  sipkey local_58;
  siphash local_48;
  
  copy_salt_to_sipkey(parser,&local_58);
  local_48.v0._0_4_ = (uint)local_58.k[0] ^ 0x70736575;
  local_48.v0._4_4_ = local_58.k[0]._4_4_ ^ 0x736f6d65;
  local_48.v1._0_4_ = (uint)local_58.k[1] ^ 0x6e646f6d;
  local_48.v1._4_4_ = local_58.k[1]._4_4_ ^ 0x646f7261;
  local_48.v2._0_4_ = (uint)local_58.k[0] ^ 0x6e657261;
  local_48.v2._4_4_ = local_58.k[0]._4_4_ ^ 0x6c796765;
  local_48.v3._0_4_ = (uint)local_58.k[1] ^ 0x79746573;
  local_48.v3._4_4_ = local_58.k[1]._4_4_ ^ 0x74656462;
  local_48.p = local_48.buf;
  local_48.c = 0;
  len = keylen(s);
  sip24_update(&local_48,s,len);
  uVar1 = sip24_final(&local_48);
  return uVar1;
}

Assistant:

static unsigned long FASTCALL
hash(XML_Parser parser, KEY s)
{
  struct siphash state;
  struct sipkey key;
  (void)sip_tobin;
  (void)sip24_valid;
  copy_salt_to_sipkey(parser, &key);
  sip24_init(&state, &key);
  sip24_update(&state, s, keylen(s) * sizeof(XML_Char));
  return (unsigned long)sip24_final(&state);
}